

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

bool testing::Mock::VerifyAndClearExpectationsLocked(void *mock_obj)

{
  long lVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  long lVar4;
  bool bVar5;
  key_type *in_RSI;
  ulong in_RDI;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  bVar5 = true;
  if ((anonymous_namespace)::g_mock_object_registry._16_8_ != 0) {
    lVar1 = 0x2a6400;
    lVar4 = (anonymous_namespace)::g_mock_object_registry._16_8_;
    do {
      bVar7 = *(ulong *)(lVar4 + 0x20) < in_RDI;
      if (!bVar7) {
        lVar1 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar7 * 8);
    } while (lVar4 != 0);
    if ((lVar1 != 0x2a6400) && (*(ulong *)(lVar1 + 0x20) <= in_RDI)) {
      pmVar2 = std::
               map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
               ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                             *)&stack0xffffffffffffffe0,in_RSI);
      p_Var3 = (pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 = &(pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var3 != p_Var6) {
        bVar5 = true;
        do {
          bVar7 = internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
                            (*(UntypedFunctionMockerBase **)(p_Var3 + 1));
          bVar5 = (bool)(bVar5 & bVar7);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        } while ((_Rb_tree_header *)p_Var3 != p_Var6);
      }
    }
  }
  return bVar5;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No EXPECT_CALL() was set on the given mock object.
    return true;
  }

  // Verifies and clears the expectations on each mock method in the
  // given mock object.
  bool expectations_met = true;
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    if (!(*it)->VerifyAndClearExpectationsLocked()) {
      expectations_met = false;
    }
  }

  // We don't clear the content of mockers, as they may still be
  // needed by ClearDefaultActionsLocked().
  return expectations_met;
}